

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opusfile.c
# Opt level: O3

int op_raw_seek(OggOpusFile *_of,opus_int64 _pos)

{
  int iVar1;
  
  iVar1 = -0x83;
  if (1 < _of->ready_state) {
    if (_of->seekable == 0) {
      iVar1 = -0x8a;
    }
    else if ((-1 < _pos) && (_pos <= _of->end)) {
      _of->op_count = 0;
      _of->od_buffer_size = 0;
      *(undefined4 *)&_of->prev_packet_gp = 0xffffffff;
      *(undefined4 *)((long)&_of->prev_packet_gp + 4) = 0xffffffff;
      *(undefined4 *)&_of->prev_page_offset = 0xffffffff;
      *(undefined4 *)((long)&_of->prev_page_offset + 4) = 0xffffffff;
      _of->ready_state = 2;
      _of->bytes_tracked = 0;
      _of->samples_tracked = 0;
      iVar1 = op_seek_helper(_of,_pos);
      if (iVar1 < 0) {
        iVar1 = -0x80;
      }
      else {
        iVar1 = op_fetch_and_process_page(_of,(ogg_page *)0x0,-1,1,1);
        if (iVar1 == -2) {
          _of->op_count = 0;
          _of->od_buffer_size = 0;
          *(undefined4 *)&_of->prev_packet_gp = 0xffffffff;
          *(undefined4 *)((long)&_of->prev_packet_gp + 4) = 0xffffffff;
          *(undefined4 *)&_of->prev_page_offset = 0xffffffff;
          *(undefined4 *)((long)&_of->prev_page_offset + 4) = 0xffffffff;
          if (_of->seekable == 0) {
            opus_tags_clear(&_of->links->tags);
          }
          _of->ready_state = 2;
          _of->cur_link = _of->nlinks + -1;
          _of->prev_packet_gp = _of->links[(long)_of->nlinks + -1].pcm_end;
          _of->cur_discard_count = 0;
          iVar1 = 0;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int op_raw_seek(OggOpusFile *_of,opus_int64 _pos){
  int ret;
  if(OP_UNLIKELY(_of->ready_state<OP_OPENED))return OP_EINVAL;
  /*Don't dump the decoder state if we can't seek.*/
  if(OP_UNLIKELY(!_of->seekable))return OP_ENOSEEK;
  if(OP_UNLIKELY(_pos<0)||OP_UNLIKELY(_pos>_of->end))return OP_EINVAL;
  /*Clear out any buffered, decoded data.*/
  op_decode_clear(_of);
  _of->bytes_tracked=0;
  _of->samples_tracked=0;
  ret=op_seek_helper(_of,_pos);
  if(OP_UNLIKELY(ret<0))return OP_EREAD;
  ret=op_fetch_and_process_page(_of,NULL,-1,1,1);
  /*If we hit EOF, op_fetch_and_process_page() leaves us uninitialized.
    Instead, jump to the end.*/
  if(ret==OP_EOF){
    int cur_link;
    op_decode_clear(_of);
    cur_link=_of->nlinks-1;
    _of->cur_link=cur_link;
    _of->prev_packet_gp=_of->links[cur_link].pcm_end;
    _of->cur_discard_count=0;
    ret=0;
  }
  return ret;
}